

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O0

int unlzw(FILE *in,FILE *out)

{
  byte bVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  void *__src;
  FILE *in_RSI;
  FILE *in_RDI;
  char_type *p;
  int o;
  int e;
  int i;
  int rsize;
  int n_bits;
  code_int maxmaxcode;
  code_int maxcode;
  code_int free_ent;
  uint bitmask;
  int outpos;
  long posbits;
  long inbits;
  code_int incode;
  code_int oldcode;
  int finchar;
  code_int code;
  char_type *stackp;
  long in_stack_ffffffffffffff48;
  uint cnt;
  voidp in_stack_ffffffffffffff50;
  long local_a0;
  uint local_94;
  int local_7c;
  uint local_78;
  uint local_74;
  long local_68;
  long local_60;
  uint local_58;
  int local_54;
  ulong local_50;
  ulong local_38;
  uint local_2c;
  ulong local_28;
  void *local_20;
  int local_4;
  
  ofd = in_RSI;
  if (inptr < insize) {
    local_94 = (uint)inbuf[inptr];
    inptr = inptr + 1;
  }
  else {
    local_94 = fill_inbuf((int)in_stack_ffffffffffffff50);
  }
  maxbits = local_94;
  block_mode = local_94 & 0x80;
  if ((local_94 & 0x60) != 0) {
    error((char *)0x260eea);
  }
  maxbits = maxbits & 0x1f;
  lVar2 = 1L << (sbyte)maxbits;
  if ((uint)maxbits < 0x11) {
    local_78 = insize;
    local_74 = 9;
    local_68 = 0x1ff;
    local_58 = 0x1ff;
    local_38 = 0xffffffffffffffff;
    local_2c = 0;
    local_54 = 0;
    local_50 = (ulong)(inptr << 3);
    iVar5 = 0x100;
    if (block_mode != 0) {
      iVar5 = 0x101;
    }
    local_60 = (long)iVar5;
    memset(prev,0,0x100);
    for (local_28 = 0xff; -1 < (long)local_28; local_28 = local_28 + -1) {
      window[local_28] = (uch)local_28;
    }
LAB_00261016:
    do {
      iVar5 = (int)((long)local_50 >> 3);
      insize = insize - iVar5;
      for (local_7c = 0; local_7c < (int)insize; local_7c = local_7c + 1) {
        inbuf[local_7c] = inbuf[local_7c + iVar5];
      }
      local_50 = 0;
      if (insize < 0x40) {
        sVar3 = fread(inbuf + insize,1,0x8000,in_RDI);
        local_78 = (uint)sVar3;
        if (local_78 == 0xffffffff) {
          error((char *)0x2610ca);
          exit_code = 1;
          return 1;
        }
        insize = local_78 + insize;
        bytes_in = (int)local_78 + bytes_in;
      }
      uVar4 = local_38;
      if (local_78 == 0) {
        local_a0 = (ulong)insize * 8 - (long)(int)(local_74 - 1);
      }
      else {
        local_a0 = ((ulong)insize - (ulong)insize % (ulong)local_74) * 8;
      }
      while (local_38 = uVar4, cnt = (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20),
            (long)local_50 < local_a0) {
        if (local_68 < local_60) {
          in_stack_ffffffffffffff50 = (voidp)(local_50 - 1);
          local_50 = (long)in_stack_ffffffffffffff50 +
                     ((long)(int)(local_74 << 3) -
                     (long)((local_50 - 1) + (long)(int)(local_74 << 3)) %
                     (long)(int)(local_74 << 3));
          local_74 = local_74 + 1;
          local_68 = lVar2;
          if (local_74 != maxbits) {
            local_68 = (1L << ((byte)local_74 & 0x3f)) + -1;
          }
          local_58 = (1 << ((byte)local_74 & 0x1f)) - 1;
          goto LAB_00261016;
        }
        uVar4 = (long)(ulong)*(uint3 *)(inbuf + ((long)local_50 >> 3)) >> ((byte)local_50 & 7) &
                (ulong)local_58;
        local_50 = (long)(int)local_74 + local_50;
        if (local_38 == 0xffffffffffffffff) {
          if (0xff < uVar4) {
            error((char *)0x2612ad);
            exit_code = 1;
            return 1;
          }
          local_2c = (uint)uVar4;
          outbuf[local_54] = (uch)uVar4;
          local_54 = local_54 + 1;
        }
        else {
          if ((uVar4 == 0x100) && (block_mode != 0)) {
            memset(prev,0,0x100);
            local_60 = 0x100;
            in_stack_ffffffffffffff48 = local_50 - 1;
            local_50 = in_stack_ffffffffffffff48 +
                       ((long)(int)(local_74 << 3) -
                       (long)((local_50 - 1) + (long)(int)(local_74 << 3)) %
                       (long)(int)(local_74 << 3));
            local_74 = 9;
            local_68 = 0x1ff;
            local_58 = 0x1ff;
            goto LAB_00261016;
          }
          local_20 = (void *)0x3eb34e;
          local_28 = uVar4;
          if (local_60 <= (long)uVar4) {
            if (local_60 < (long)uVar4) {
              if (0 < local_54) {
                write_buf(in_stack_ffffffffffffff50,cnt);
                bytes_out = local_54 + bytes_out;
              }
              error((char *)0x261427);
              exit_code = 1;
              return 1;
            }
            d_buf[0x7ffe]._1_1_ = (undefined1)local_2c;
            local_20 = (void *)0x3eb34d;
            local_28 = local_38;
          }
          for (; 0xff < local_28; local_28 = (ulong)prev[local_28]) {
            *(uch *)((long)local_20 + -1) = window[local_28];
            local_20 = (void *)((long)local_20 + -1);
          }
          bVar1 = window[local_28];
          local_2c = (uint)bVar1;
          __src = (void *)((long)local_20 + -1);
          *(byte *)((long)local_20 + -1) = bVar1;
          local_7c = 0x3eb34e - (int)__src;
          local_20 = __src;
          if (local_54 + local_7c < 0x4000) {
            memcpy(outbuf + local_54,__src,(long)local_7c);
            local_54 = local_7c + local_54;
          }
          else {
            do {
              if (0x4000 - local_54 < local_7c) {
                local_7c = 0x4000 - local_54;
              }
              if (0 < local_7c) {
                memcpy(outbuf + local_54,local_20,(long)local_7c);
                local_54 = local_7c + local_54;
              }
              if (0x3fff < local_54) {
                write_buf(in_stack_ffffffffffffff50,(uint)((ulong)in_stack_ffffffffffffff48 >> 0x20)
                         );
                bytes_out = local_54 + bytes_out;
                local_54 = 0;
              }
              lVar6 = (long)local_7c;
              local_7c = 0x3eb34e - (int)(void *)((long)local_20 + lVar6);
              local_20 = (void *)((long)local_20 + lVar6);
            } while (0 < local_7c);
          }
          if (local_60 < lVar2) {
            prev[local_60] = (ush)local_38;
            window[local_60] = bVar1;
            local_60 = local_60 + 1;
          }
        }
      }
    } while (local_78 != 0);
    if (0 < local_54) {
      write_buf(in_stack_ffffffffffffff50,cnt);
      bytes_out = local_54 + bytes_out;
    }
    local_4 = 0;
  }
  else {
    error((char *)0x260f23);
    exit_code = 1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

local int unlzw(FILE *in, FILE *out) 
    /* input and output file descriptors */
{
    REG2   char_type  *stackp;
    REG3   code_int   code;
    REG4   int        finchar;
    REG5   code_int   oldcode;
    REG6   code_int   incode;
    REG7   long       inbits;
    REG8   long       posbits;
    REG9   int        outpos;
/*  REG10  int        insize; (global) */
    REG11  unsigned   bitmask;
    REG12  code_int   free_ent;
    REG13  code_int   maxcode;
    REG14  code_int   maxmaxcode;
    REG15  int        n_bits;
    REG16  int        rsize;
    
    ofd = out;

#ifdef MAXSEG_64K
    tab_prefix[0] = tab_prefix0;
    tab_prefix[1] = tab_prefix1;
#endif
    maxbits = get_byte();
    block_mode = maxbits & BLOCK_MODE;
    if ((maxbits & LZW_RESERVED) != 0) {
	error( "warning, unknown flags in unlzw decompression");
    }
    maxbits &= BIT_MASK;
    maxmaxcode = MAXCODE(maxbits);
    
    if (maxbits > BITS) {
	error("compressed with too many bits; cannot handle file");
	exit_code = ERROR;
	return ERROR;
    }
    rsize = insize;
    maxcode = MAXCODE(n_bits = INIT_BITS)-1;
    bitmask = (1<<n_bits)-1;
    oldcode = -1;
    finchar = 0;
    outpos = 0;
    posbits = inptr<<3;

    free_ent = ((block_mode) ? FIRST : 256);
    
    clear_tab_prefixof(); /* Initialize the first 256 entries in the table. */
    
    for (code = 255 ; code >= 0 ; --code) {
	tab_suffixof(code) = (char_type)code;
    }
    do {
	REG1 int i;
	int  e;
	int  o;
	
    resetbuf:
	e = insize-(o = (posbits>>3));
	
	for (i = 0 ; i < e ; ++i) {
	    inbuf[i] = inbuf[i+o];
	}
	insize = e;
	posbits = 0;
	
	if (insize < INBUF_EXTRA) {
/*  modified to use fread instead of read - WDP 10/22/97  */
/*	    if ((rsize = read(in, (char*)inbuf+insize, INBUFSIZ)) == EOF) { */

	    if ((rsize = fread((char*)inbuf+insize, 1, INBUFSIZ, in)) == EOF) {
		error("unexpected end of file");
	        exit_code = ERROR;
                return ERROR;
	    }
	    insize += rsize;
	    bytes_in += (ulg)rsize;
	}
	inbits = ((rsize != 0) ? ((long)insize - insize%n_bits)<<3 : 
		  ((long)insize<<3)-(n_bits-1));
	
	while (inbits > posbits) {
	    if (free_ent > maxcode) {
		posbits = ((posbits-1) +
			   ((n_bits<<3)-(posbits-1+(n_bits<<3))%(n_bits<<3)));
		++n_bits;
		if (n_bits == maxbits) {
		    maxcode = maxmaxcode;
		} else {
		    maxcode = MAXCODE(n_bits)-1;
		}
		bitmask = (1<<n_bits)-1;
		goto resetbuf;
	    }
	    input(inbuf,posbits,code,n_bits,bitmask);
	    Tracev((stderr, "%d ", code));

	    if (oldcode == -1) {
		if (code >= 256) {
                    error("corrupt input.");
	            exit_code = ERROR;
                    return ERROR;
                }

		outbuf[outpos++] = (char_type)(finchar = (int)(oldcode=code));
		continue;
	    }
	    if (code == CLEAR && block_mode) {
		clear_tab_prefixof();
		free_ent = FIRST - 1;
		posbits = ((posbits-1) +
			   ((n_bits<<3)-(posbits-1+(n_bits<<3))%(n_bits<<3)));
		maxcode = MAXCODE(n_bits = INIT_BITS)-1;
		bitmask = (1<<n_bits)-1;
		goto resetbuf;
	    }
	    incode = code;
	    stackp = de_stack;
	    
	    if (code >= free_ent) { /* Special case for KwKwK string. */
		if (code > free_ent) {
		    if (outpos > 0) {
			write_buf((char*)outbuf, outpos);
			bytes_out += (ulg)outpos;
		    }
		    error("corrupt input.");
	            exit_code = ERROR;
                    return ERROR;

		}
		*--stackp = (char_type)finchar;
		code = oldcode;
	    }

	    while ((cmp_code_int)code >= (cmp_code_int)256) {
		/* Generate output characters in reverse order */
		*--stackp = tab_suffixof(code);
		code = tab_prefixof(code);
	    }
	    *--stackp =	(char_type)(finchar = tab_suffixof(code));
	    
	    /* And put them out in forward order */
	    {
	/*	REG1 int	i;   already defined above (WDP) */
	    
		if (outpos+(i = (de_stack-stackp)) >= OUTBUFSIZ) {
		    do {
			if (i > OUTBUFSIZ-outpos) i = OUTBUFSIZ-outpos;

			if (i > 0) {
			    memcpy(outbuf+outpos, stackp, i);
			    outpos += i;
			}
			if (outpos >= OUTBUFSIZ) {
			    write_buf((char*)outbuf, outpos);
			    bytes_out += (ulg)outpos;
			    outpos = 0;
			}
			stackp+= i;
		    } while ((i = (de_stack-stackp)) > 0);
		} else {
		    memcpy(outbuf+outpos, stackp, i);
		    outpos += i;
		}
	    }

	    if ((code = free_ent) < maxmaxcode) { /* Generate the new entry. */

		tab_prefixof(code) = (unsigned short)oldcode;
		tab_suffixof(code) = (char_type)finchar;
		free_ent = code+1;
	    } 
	    oldcode = incode;	/* Remember previous code.	*/
	}
    } while (rsize != 0);
    
    if (outpos > 0) {
	write_buf((char*)outbuf, outpos);
	bytes_out += (ulg)outpos;
    }
    return OK;
}